

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O0

void __thiscall
google::protobuf::internal::gtest_suite_Utf8ValidationTest_::
ReadArbitraryBytes<proto2_unittest::TestAllTypes>::~ReadArbitraryBytes
          (ReadArbitraryBytes<proto2_unittest::TestAllTypes> *this)

{
  ReadArbitraryBytes<proto2_unittest::TestAllTypes> *this_local;
  
  ~ReadArbitraryBytes(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST_P(Utf8ValidationTest, ReadArbitraryBytes) {
  std::string wire_buffer;
  typename TestFixture::OneBytes input;
  WriteMessage(this->kInvalidUTF8String, &input, &wire_buffer);
  typename TestFixture::OneBytes output;
  {
    absl::ScopedMockLog log(absl::MockLogDefault::kDisallowUnexpected);
    EXPECT_CALL(log, Log(absl::LogSeverity::kError, testing::_, testing::_))
        .Times(0);
    log.StartCapturingLogs();
    ReadMessage(wire_buffer, &output);
  }
  EXPECT_EQ(input.data(), output.data());
}